

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O2

void __thiscall
PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::flush_output
          (ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this,
          int outputs)

{
  if ((outputs & 2U) == 0) {
    return;
  }
  PCSpeaker::update(&this->speaker_);
  Concurrency::AsyncTaskQueue<false,_true,_void>::perform(&(this->speaker_).queue);
  return;
}

Assistant:

void flush_output(int outputs) final {
			if(outputs & Output::Audio) {
				speaker_.update();
				speaker_.queue.perform();
			}
		}